

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::HttpServerErrorHandler::handleApplicationError
          (HttpServerErrorHandler *this,Exception *exception,
          Maybe<kj::HttpService::Response_&> *response)

{
  ArrayDisposer **this_00;
  StringPtr value;
  Type TVar1;
  Response *pRVar2;
  AsyncOutputStream *pAVar3;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *attachments_1;
  Maybe<kj::HttpService::Response_&> *in_RCX;
  bool local_249;
  undefined1 auStack_248 [7];
  bool _kj_shouldLog_1;
  size_t local_240;
  ArrayPtr<const_unsigned_char> local_238;
  undefined1 local_228 [32];
  StringPtr local_208;
  Own<kj::AsyncOutputStream,_std::nullptr_t> local_1f8;
  String local_1e8;
  size_t local_1d0;
  Maybe<unsigned_long> local_1c8;
  StringPtr local_1b8;
  Own<kj::AsyncOutputStream,_std::nullptr_t> local_1a8;
  String local_198;
  size_t local_180;
  Maybe<unsigned_long> local_178;
  StringPtr local_168;
  Own<kj::AsyncOutputStream,_std::nullptr_t> local_158;
  String local_148;
  undefined1 local_130 [8];
  Own<kj::AsyncOutputStream,_std::nullptr_t> body;
  String errorMessage;
  size_t local_100;
  undefined1 local_d8 [8];
  HttpHeaders headers;
  HttpHeaderTable headerTable;
  bool _kj_shouldLog;
  Response *r;
  Response *_r8299;
  Maybe<kj::HttpService::Response_&> *response_local;
  Exception *exception_local;
  HttpServerErrorHandler *this_local;
  
  TVar1 = Exception::getType((Exception *)response);
  if (TVar1 == DISCONNECTED) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    pRVar2 = kj::_::readMaybe<kj::HttpService::Response>(in_RCX);
    if (pRVar2 == (Response *)0x0) {
      local_249 = kj::_::Debug::shouldLog(ERROR);
      while (local_249 != false) {
        kj::_::Debug::log<char_const(&)[64],char_const(&)[35],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x2087,ERROR,
                   "\"HttpService threw exception after generating a partial response\", \"too late to report error to client\", exception"
                   ,(char (*) [64])"HttpService threw exception after generating a partial response"
                   ,(char (*) [35])"too late to report error to client",(Exception *)response);
        local_249 = false;
      }
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    }
    else {
      headerTable._55_1_ = kj::_::Debug::shouldLog(INFO);
      while (headerTable._55_1_ != '\0') {
        kj::_::Debug::log<char_const(&)[44],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x206c,INFO,"\"threw exception while serving HTTP response\", exception",
                   (char (*) [44])"threw exception while serving HTTP response",
                   (Exception *)response);
        headerTable._55_1_ = 0;
      }
      this_00 = &headers.ownedStrings.builder.disposer;
      HttpHeaderTable::HttpHeaderTable((HttpHeaderTable *)this_00);
      HttpHeaders::HttpHeaders((HttpHeaders *)local_d8,(HttpHeaderTable *)this_00);
      StringPtr::StringPtr((StringPtr *)&errorMessage.content.disposer,"text/plain");
      value.content.size_ = local_100;
      value.content.ptr = (char *)errorMessage.content.disposer;
      HttpHeaders::set((HttpHeaders *)local_d8,(HttpHeaderId)(ZEXT416(0xe) << 0x40),value);
      String::String((String *)&body.ptr);
      Own<kj::AsyncOutputStream,_std::nullptr_t>::Own
                ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_130);
      TVar1 = Exception::getType((Exception *)response);
      if (TVar1 == OVERLOADED) {
        str<char_const(&)[75],kj::Exception&>
                  (&local_148,
                   (kj *)
                   "ERROR: The server is temporarily unable to handle your request. Details:\n\n",
                   (char (*) [75])response,(Exception *)errorMessage.content.disposer);
        String::operator=((String *)&body.ptr,&local_148);
        String::~String(&local_148);
        StringPtr::StringPtr(&local_168,"Service Unavailable");
        local_180 = String::size((String *)&body.ptr);
        Maybe<unsigned_long>::Maybe(&local_178,&local_180);
        (**pRVar2->_vptr_Response)
                  (&local_158,pRVar2,0x1f7,local_168.content.ptr,local_168.content.size_,local_d8,
                   &local_178);
        Own<kj::AsyncOutputStream,_std::nullptr_t>::operator=
                  ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_130,&local_158);
        Own<kj::AsyncOutputStream,_std::nullptr_t>::~Own(&local_158);
        Maybe<unsigned_long>::~Maybe(&local_178);
      }
      else {
        TVar1 = Exception::getType((Exception *)response);
        if (TVar1 == UNIMPLEMENTED) {
          str<char_const(&)[64],kj::Exception&>
                    (&local_198,
                     (kj *)"ERROR: The server does not implement this operation. Details:\n\n",
                     (char (*) [64])response,(Exception *)errorMessage.content.disposer);
          String::operator=((String *)&body.ptr,&local_198);
          String::~String(&local_198);
          StringPtr::StringPtr(&local_1b8,"Not Implemented");
          local_1d0 = String::size((String *)&body.ptr);
          Maybe<unsigned_long>::Maybe(&local_1c8,&local_1d0);
          (**pRVar2->_vptr_Response)
                    (&local_1a8,pRVar2,0x1f5,local_1b8.content.ptr,local_1b8.content.size_,local_d8,
                     &local_1c8);
          Own<kj::AsyncOutputStream,_std::nullptr_t>::operator=
                    ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_130,&local_1a8);
          Own<kj::AsyncOutputStream,_std::nullptr_t>::~Own(&local_1a8);
          Maybe<unsigned_long>::~Maybe(&local_1c8);
        }
        else {
          str<char_const(&)[49],kj::Exception&>
                    (&local_1e8,(kj *)"ERROR: The server threw an exception. Details:\n\n",
                     (char (*) [49])response,(Exception *)errorMessage.content.disposer);
          String::operator=((String *)&body.ptr,&local_1e8);
          String::~String(&local_1e8);
          StringPtr::StringPtr(&local_208,"Internal Server Error");
          local_228._8_8_ = String::size((String *)&body.ptr);
          Maybe<unsigned_long>::Maybe
                    ((Maybe<unsigned_long> *)(local_228 + 0x10),(unsigned_long *)(local_228 + 8));
          (**pRVar2->_vptr_Response)
                    (&local_1f8,pRVar2,500,local_208.content.ptr,local_208.content.size_,local_d8,
                     local_228 + 0x10);
          Own<kj::AsyncOutputStream,_std::nullptr_t>::operator=
                    ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_130,&local_1f8);
          Own<kj::AsyncOutputStream,_std::nullptr_t>::~Own(&local_1f8);
          Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)(local_228 + 0x10));
        }
      }
      pAVar3 = Own<kj::AsyncOutputStream,_std::nullptr_t>::operator->
                         ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_130);
      _auStack_248 = String::asBytes((String *)&body.ptr);
      local_238 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)auStack_248);
      (**pAVar3->_vptr_AsyncOutputStream)(local_228,pAVar3,local_238.ptr,local_238.size_);
      attachments_1 =
           (Own<kj::AsyncOutputStream,_std::nullptr_t> *)mv<kj::String>((String *)&body.ptr);
      mv<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
                ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_130);
      Promise<void>::attach<kj::String,kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
                ((Promise<void> *)this,(String *)local_228,attachments_1);
      Promise<void>::~Promise((Promise<void> *)local_228);
      Own<kj::AsyncOutputStream,_std::nullptr_t>::~Own
                ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_130);
      String::~String((String *)&body.ptr);
      HttpHeaders::~HttpHeaders((HttpHeaders *)local_d8);
      HttpHeaderTable::~HttpHeaderTable((HttpHeaderTable *)&headers.ownedStrings.builder.disposer);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServerErrorHandler::handleApplicationError(
    kj::Exception exception, kj::Maybe<kj::HttpService::Response&> response) {
  // Default error handler implementation.

  if (exception.getType() == kj::Exception::Type::DISCONNECTED) {
    // How do we tell an HTTP client that there was a transient network error, and it should
    // try again immediately? There's no HTTP status code for this (503 is meant for "try
    // again later, not now"). Here's an idea: Don't send any response; just close the
    // connection, so that it looks like the connection between the HTTP client and server
    // was dropped. A good client should treat this exactly the way we want.
    //
    // We also bail here to avoid logging the disconnection, which isn't very interesting.
    return kj::READY_NOW;
  }

  KJ_IF_SOME(r, response) {
    KJ_LOG(INFO, "threw exception while serving HTTP response", exception);

    HttpHeaderTable headerTable {};
    HttpHeaders headers(headerTable);
    headers.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

    kj::String errorMessage;
    kj::Own<AsyncOutputStream> body;

    if (exception.getType() == kj::Exception::Type::OVERLOADED) {
      errorMessage = kj::str(
          "ERROR: The server is temporarily unable to handle your request. Details:\n\n", exception);
      body = r.send(503, "Service Unavailable", headers, errorMessage.size());
    } else if (exception.getType() == kj::Exception::Type::UNIMPLEMENTED) {
      errorMessage = kj::str(
          "ERROR: The server does not implement this operation. Details:\n\n", exception);
      body = r.send(501, "Not Implemented", headers, errorMessage.size());
    } else {
      errorMessage = kj::str(
          "ERROR: The server threw an exception. Details:\n\n", exception);
      body = r.send(500, "Internal Server Error", headers, errorMessage.size());
    }

    return body->write(errorMessage.asBytes()).attach(kj::mv(errorMessage), kj::mv(body));
  }

  KJ_LOG(ERROR, "HttpService threw exception after generating a partial response",
                "too late to report error to client", exception);
  return kj::READY_NOW;
}